

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextItem(char *str_id,ImGuiPopupFlags popup_flags)

{
  ImGuiWindow *this;
  bool bVar1;
  ImGuiID local_34;
  int mouse_button;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiPopupFlags popup_flags_local;
  char *str_id_local;
  
  this = GImGui->CurrentWindow;
  if ((this->SkipItems & 1U) == 0) {
    if (str_id == (char *)0x0) {
      local_34 = (this->DC).LastItemId;
    }
    else {
      local_34 = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    }
    if (local_34 == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x2221,"bool ImGui::BeginPopupContextItem(const char *, ImGuiPopupFlags)");
    }
    bVar1 = IsMouseReleased(popup_flags & 0x1f);
    if ((bVar1) && (bVar1 = IsItemHovered(8), bVar1)) {
      OpenPopupEx(local_34,popup_flags);
    }
    str_id_local._7_1_ = BeginPopupEx(local_34,0x141);
  }
  else {
    str_id_local._7_1_ = false;
  }
  return str_id_local._7_1_;
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    if (window->SkipItems)
        return false;
    ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
    IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        OpenPopupEx(id, popup_flags);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings);
}